

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::Config::getTestListFile_abi_cxx11_(Config *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x128));
  return in_RDI;
}

Assistant:

std::string Config::getTestListFile() const { return m_data.testListFile; }